

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

void amrex::MultiFab::AddProduct
               (MultiFab *dst,MultiFab *src1,int comp1,MultiFab *src2,int comp2,int dstcomp,
               int numcomp,IntVect *nghost)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Box local_1d0;
  int local_1b4;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  FabArray<amrex::FArrayBox> *local_180;
  FabArray<amrex::FArrayBox> *local_178;
  FabArray<amrex::FArrayBox> *local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  Array4<double> dfab;
  Array4<const_double> s2fab;
  Array4<const_double> s1fab;
  MFIter mfi;
  
  local_180 = &dst->super_FabArray<amrex::FArrayBox>;
  local_178 = &src1->super_FabArray<amrex::FArrayBox>;
  local_170 = &src2->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&mfi,(FabArrayBase *)dst,true);
  if (numcomp < 1) {
    numcomp = 0;
  }
  local_168 = (ulong)(uint)numcomp;
  local_190 = (long)comp2 << 3;
  local_198 = (long)comp1 << 3;
  local_188 = (long)dstcomp << 3;
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    MFIter::growntilebox(&local_1d0,&mfi,nghost);
    if ((((local_1d0.smallend.vect[0] <= local_1d0.bigend.vect[0]) &&
         (local_1d0.smallend.vect[1] <= local_1d0.bigend.vect[1])) &&
        (local_1d0.smallend.vect[2] <= local_1d0.bigend.vect[2])) && (local_1d0.btype.itype < 8)) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&s1fab,local_178,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&s2fab,local_170,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&dfab,local_180,&mfi);
      lVar8 = (long)local_1d0.smallend.vect[1];
      local_160 = (long)local_1d0.smallend.vect[2];
      local_1b4 = local_1d0.bigend.vect[2];
      lVar5 = (long)local_1d0.smallend.vect[0] * 8;
      local_1a0 = local_188;
      local_1a8 = local_198;
      local_1b0 = local_190;
      for (local_158 = 0; lVar2 = local_160, local_158 != local_168; local_158 = local_158 + 1) {
        for (; (int)lVar2 <= local_1d0.bigend.vect[2]; lVar2 = lVar2 + 1) {
          lVar4 = (long)s2fab.p +
                  s2fab.nstride * local_1b0 +
                  (lVar2 - s2fab.begin.z) * s2fab.kstride * 8 +
                  (lVar8 - s2fab.begin.y) * s2fab.jstride * 8 + (long)s2fab.begin.x * -8 + lVar5;
          lVar7 = (long)s1fab.p +
                  s1fab.nstride * local_1a8 +
                  (lVar8 - s1fab.begin.y) * s1fab.jstride * 8 +
                  (lVar2 - s1fab.begin.z) * s1fab.kstride * 8 + (long)s1fab.begin.x * -8 + lVar5;
          lVar6 = (long)dfab.p +
                  dfab.nstride * local_1a0 +
                  (lVar8 - dfab.begin.y) * dfab.jstride * 8 +
                  (lVar2 - dfab.begin.z) * dfab.kstride * 8 + (long)dfab.begin.x * -8 + lVar5;
          for (lVar1 = lVar8; lVar1 <= local_1d0.bigend.vect[1]; lVar1 = lVar1 + 1) {
            if (local_1d0.smallend.vect[0] <= local_1d0.bigend.vect[0]) {
              lVar3 = 0;
              do {
                *(double *)(lVar6 + lVar3 * 8) =
                     *(double *)(lVar7 + lVar3 * 8) * *(double *)(lVar4 + lVar3 * 8) +
                     *(double *)(lVar6 + lVar3 * 8);
                lVar3 = lVar3 + 1;
              } while ((local_1d0.bigend.vect[0] - local_1d0.smallend.vect[0]) + 1 != (int)lVar3);
            }
            lVar4 = lVar4 + s2fab.jstride * 8;
            lVar7 = lVar7 + s1fab.jstride * 8;
            lVar6 = lVar6 + dfab.jstride * 8;
          }
        }
        local_1b0 = local_1b0 + 8;
        local_1a8 = local_1a8 + 8;
        local_1a0 = local_1a0 + 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MultiFab::AddProduct (MultiFab& dst,
                      const MultiFab& src1, int comp1,
                      const MultiFab& src2, int comp2,
                      int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == src1.boxArray());
    BL_ASSERT(dst.distributionMap == src1.distributionMap);
    BL_ASSERT(dst.boxArray() == src2.boxArray());
    BL_ASSERT(dst.distributionMap == src2.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && src1.nGrowVect().allGE(nghost) && src2.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::AddProduct()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& src1ma = src1.const_arrays();
        auto const& src2ma = src2.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,n+dstcomp) += src1ma[box_no](i,j,k,n+comp1)
                *                             src2ma[box_no](i,j,k,n+comp2);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok()) {
                auto const s1fab = src1.array(mfi);
                auto const s2fab = src2.array(mfi);
                auto        dfab =  dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,n+dstcomp) += s1fab(i,j,k,n+comp1) * s2fab(i,j,k,n+comp2);
                });
            }
        }
    }
}